

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor2008.h
# Opt level: O3

uint32_t FastPForLib::PFor2008::determineBestBase(DATATYPE *in,size_t size,uint32_t maxb)

{
  int *piVar1;
  ulong uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  undefined1 (*pauVar8) [64];
  uint uVar9;
  ulong uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  size_t sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_ZMM1 [64];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_XMM8 [16];
  
  auVar15 = in_ZMM1._0_16_;
  if (size == 0) {
    uVar12 = 0;
  }
  else {
    sVar13 = 0x10000;
    if (size < 0x10000) {
      sVar13 = size;
    }
    pauVar8 = (undefined1 (*) [64])operator_new(0x84);
    uVar10 = 0;
    *(undefined4 *)pauVar8[2] = 0;
    *pauVar8 = ZEXT864(0) << 0x40;
    pauVar8[1] = ZEXT864(0) << 0x40;
    if (0x10000 < size) {
      uVar6 = rand();
      uVar10 = (ulong)uVar6 % (ulong)(uint)((int)size - (int)sVar13);
    }
    uVar6 = (uint)uVar10;
    uVar2 = sVar13 + uVar10;
    do {
      uVar6 = uVar6 + 1;
      uVar9 = in[uVar10];
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        iVar7 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        uVar9 = iVar7 + 1;
      }
      piVar1 = (int *)((long)*pauVar8 + (ulong)uVar9 * 4);
      *piVar1 = *piVar1 + 1;
      uVar10 = (ulong)uVar6;
    } while (uVar10 < uVar2);
    if (maxb == 0) {
      uVar12 = 0;
    }
    else {
      auVar15 = vcvtusi2sd_avx512f(auVar15,maxb);
      iVar7 = 0;
      uVar11 = maxb;
      uVar12 = maxb;
      auVar14 = auVar15;
      do {
        iVar7 = iVar7 + *(int *)((long)*pauVar8 + (ulong)uVar11 * 4);
        uVar6 = uVar11 - 1;
        auVar18 = vcvtusi2sd_avx512f(in_XMM8,iVar7);
        auVar17._0_8_ = auVar18._0_8_ / (double)(long)sVar13;
        auVar17._8_8_ = auVar18._8_8_;
        if (iVar7 != 0) {
          auVar5 = vfmadd213sd_fma(ZEXT816(0x4060000000000000),auVar17,ZEXT816(0xbff0000000000000));
          auVar18 = vcvtusi2sd_avx512f(in_XMM8,1 << (uVar6 & 0x1f));
          auVar18._0_8_ = auVar5._0_8_ / (auVar17._0_8_ * auVar18._0_8_);
          auVar18._8_8_ = auVar5._8_8_;
          auVar17 = vmaxsd_avx(auVar18,auVar17);
        }
        auVar18 = vcvtusi2sd_avx512f(in_XMM8,uVar6);
        auVar17 = vfmadd231sd_fma(auVar18,auVar15,auVar17);
        dVar16 = auVar14._0_8_;
        uVar3 = vcmpsd_avx512f(auVar17,auVar14,6);
        bVar4 = (bool)((byte)uVar3 & 1);
        auVar14._0_8_ = (ulong)bVar4 * (long)dVar16 + (ulong)!bVar4 * (long)auVar17._0_8_;
        auVar14._8_8_ = auVar17._8_8_;
        if (auVar17._0_8_ <= dVar16) {
          uVar12 = uVar6;
        }
        uVar9 = uVar11 - 2;
        uVar11 = uVar6;
      } while (uVar9 < maxb);
    }
    operator_delete(pauVar8);
  }
  return uVar12;
}

Assistant:

static uint32_t determineBestBase(const DATATYPE *in, size_t size,
                                    const uint32_t maxb) {
    if (size == 0)
      return 0;
    const size_t defaultsamplesize = 64 * 1024;
    // the original paper describes sorting
    // a sample, but this only makes sense if you
    // are coding a frame of reference.
    size_t samplesize = size > defaultsamplesize ? defaultsamplesize : size;
    std::vector<uint32_t> freqs(33);
    // we choose the sample to be consecutive
    uint32_t rstart =
        size > samplesize
            ? (rand() % (static_cast<uint32_t>(size - samplesize)))
            : 0U;
    for (uint32_t k = rstart; k < rstart + samplesize; ++k) {
      freqs[asmbits(in[k])]++;
    }
    uint32_t bestb = maxb;
    uint32_t numberofexceptions = 0;
    double Erate = 0;
    double bestcost = maxb;
    for (uint32_t b = bestb - 1; b < maxb; --b) {
      numberofexceptions += freqs[b + 1];
      Erate = static_cast<double>(numberofexceptions) /
              static_cast<double>(samplesize);
      /**
       * though this is not explicit in the original paper, you
       * need to somehow compensate for compulsory exceptions
       * when the chosen number of bits is small.
       *
       * We use their formula (3.1.5) to estimate actual number
       * of total exceptions, including compulsory exceptions.
       */
      if (numberofexceptions > 0) {
        double altErate = (Erate * 128 - 1) / (Erate * (1U << b));
        if (altErate > Erate)
          Erate = altErate;
      }
      const double thiscost = b + Erate * maxb;
      if (thiscost <= bestcost) {
        bestcost = thiscost;
        bestb = b;
      }
    }
    return bestb;
  }